

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int MemHashCursorSeek(unqlite_kv_cursor *pCursor,void *pKey,int nByte,int iPos)

{
  int iVar1;
  mem_hash_record *pmVar2;
  
  pmVar2 = MemHashGetEntry((mem_hash_kv_engine *)pCursor->pStore,pKey,nByte);
  pCursor[1].pStore = (unqlite_kv_engine *)pmVar2;
  iVar1 = -6;
  if (pmVar2 != (mem_hash_record *)0x0) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int MemHashCursorSeek(unqlite_kv_cursor *pCursor,const void *pKey,int nByte,int iPos)
{
	mem_hash_kv_engine *pEngine = (mem_hash_kv_engine *)pCursor->pStore;
	mem_hash_cursor *pMem = (mem_hash_cursor *)pCursor;
	/* Perform the lookup */
	pMem->pCur = MemHashGetEntry(pEngine,pKey,nByte);
	if( pMem->pCur == 0 ){
		if( iPos != UNQLITE_CURSOR_MATCH_EXACT ){
			/* noop; */
		}
		/* No such record */
		return UNQLITE_NOTFOUND;
	}
	return UNQLITE_OK;
}